

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFlatImage.cpp
# Opt level: O2

void anon_unknown.dwarf_b4f9::verifyImagesAreEqual(FlatImage *img1,FlatImage *img2,int dx,int dy)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  FlatImageLevel *pFVar5;
  FlatImageLevel *pFVar6;
  ArgExc *this;
  int x;
  int y;
  
  iVar1 = Imf_3_4::Image::levelMode();
  iVar2 = Imf_3_4::Image::levelMode();
  if (iVar1 == iVar2) {
    iVar1 = Imf_3_4::Image::levelRoundingMode();
    iVar2 = Imf_3_4::Image::levelRoundingMode();
    if (iVar1 == iVar2) {
      iVar1 = Imf_3_4::Image::numXLevels();
      iVar2 = Imf_3_4::Image::numXLevels();
      if (iVar1 == iVar2) {
        iVar1 = Imf_3_4::Image::numYLevels();
        iVar2 = Imf_3_4::Image::numYLevels();
        if (iVar1 == iVar2) {
          iVar1 = Imf_3_4::Image::levelMode();
          if (iVar1 == 0) {
            poVar4 = std::operator<<((ostream *)&std::cout,"        level 0");
            std::endl<char,std::char_traits<char>>(poVar4);
            pFVar5 = (FlatImageLevel *)(**(code **)(*(long *)img1 + 0x20))(img1,0);
            pFVar6 = (FlatImageLevel *)(**(code **)(*(long *)img2 + 0x20))(img2,0);
            verifyLevelsAreEqual(pFVar5,pFVar6,dx,dy);
            return;
          }
          if (iVar1 == 1) {
            iVar1 = 0;
            while( true ) {
              iVar2 = Imf_3_4::Image::numLevels();
              if (iVar2 <= iVar1) break;
              poVar4 = std::operator<<((ostream *)&std::cout,"        level ");
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
              poVar4 = std::operator<<(poVar4,"");
              std::endl<char,std::char_traits<char>>(poVar4);
              pFVar5 = (FlatImageLevel *)(**(code **)(*(long *)img1 + 0x20))(img1,iVar1);
              pFVar6 = (FlatImageLevel *)(**(code **)(*(long *)img2 + 0x20))(img2,iVar1);
              verifyLevelsAreEqual(pFVar5,pFVar6,dx,dy);
              iVar1 = iVar1 + 1;
            }
          }
          else {
            if (iVar1 != 2) {
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRUtilTest/testFlatImage.cpp"
                            ,0xa3,
                            "void (anonymous namespace)::verifyImagesAreEqual(const FlatImage &, const FlatImage &, int, int)"
                           );
            }
            iVar1 = 0;
            while( true ) {
              iVar2 = Imf_3_4::Image::numYLevels();
              if (iVar2 <= iVar1) break;
              iVar2 = 0;
              while( true ) {
                iVar3 = Imf_3_4::Image::numXLevels();
                if (iVar3 <= iVar2) break;
                poVar4 = std::operator<<((ostream *)&std::cout,"        level (");
                poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
                poVar4 = std::operator<<(poVar4,", ");
                poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
                poVar4 = std::operator<<(poVar4,")");
                std::endl<char,std::char_traits<char>>(poVar4);
                pFVar5 = (FlatImageLevel *)(**(code **)(*(long *)img1 + 0x30))(img1,iVar2,iVar1);
                pFVar6 = (FlatImageLevel *)(**(code **)(*(long *)img2 + 0x30))(img2,iVar2,iVar1);
                verifyLevelsAreEqual(pFVar5,pFVar6,dx,dy);
                iVar2 = iVar2 + 1;
              }
              iVar1 = iVar1 + 1;
            }
          }
          return;
        }
      }
      this = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc(this,"different number of levels");
    }
    else {
      this = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc(this,"different level rounding modes");
    }
  }
  else {
    this = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(this,"different level modes");
  }
  __cxa_throw(this,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void
verifyImagesAreEqual (
    const FlatImage& img1, const FlatImage& img2, int dx = 0, int dy = 0)
{
    if (img1.levelMode () != img2.levelMode ())
        throw ArgExc ("different level modes");

    if (img1.levelRoundingMode () != img2.levelRoundingMode ())
        throw ArgExc ("different level rounding modes");

    if (img1.numXLevels () != img2.numXLevels () ||
        img1.numYLevels () != img2.numYLevels ())
        throw ArgExc ("different number of levels");

    switch (img1.levelMode ())
    {
        case ONE_LEVEL:

            cout << "        level 0" << endl;

            verifyLevelsAreEqual (img1.level (), img2.level (), dx, dy);

            break;

        case MIPMAP_LEVELS:

            for (int x = 0; x < img1.numLevels (); ++x)
            {
                cout << "        level " << x << "" << endl;

                verifyLevelsAreEqual (img1.level (x), img2.level (x), dx, dy);
            }

            break;

        case RIPMAP_LEVELS:

            for (int y = 0; y < img1.numYLevels (); ++y)
            {
                for (int x = 0; x < img1.numXLevels (); ++x)
                {
                    cout << "        level (" << x << ", " << y << ")" << endl;

                    verifyLevelsAreEqual (
                        img1.level (x, y), img2.level (x, y), dx, dy);
                }
            }

            break;

        default: assert (false);
    }
}